

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O2

ItemFlags __thiscall InsertProxyModel::flags(InsertProxyModel *this,QModelIndex *index)

{
  int iVar1;
  InsertProxyModelPrivate *pIVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long *plVar7;
  long *plVar8;
  undefined8 uVar9;
  byte bVar10;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  bVar3 = QModelIndex::isValid(index);
  if (!bVar3) {
    return (ItemFlags)0;
  }
  lVar6 = QAbstractProxyModel::sourceModel();
  if (lVar6 == 0) {
    return (ItemFlags)0;
  }
  pIVar2 = this->m_dptr;
  iVar1 = index->r;
  plVar7 = (long *)QAbstractProxyModel::sourceModel();
  local_58 = 0xffffffffffffffff;
  local_50 = 0;
  uStack_48 = 0;
  iVar4 = (**(code **)(*plVar7 + 0x78))(plVar7);
  if (iVar1 == iVar4) {
    bVar10 = (byte)(pIVar2->m_insertDirection).i & 1;
  }
  else {
    bVar10 = 0;
  }
  iVar1 = index->c;
  plVar7 = (long *)QAbstractProxyModel::sourceModel();
  local_58 = 0xffffffffffffffff;
  local_50 = 0;
  uStack_48 = 0;
  iVar4 = (**(code **)(*plVar7 + 0x80))(plVar7);
  if (iVar1 == iVar4) {
    uVar5 = (pIVar2->m_insertDirection).i;
    if ((bVar10 & (byte)((uVar5 & 2) >> 1)) != 0) {
      return (ItemFlags)0;
    }
    if (bVar10 != 0) goto LAB_00140d93;
    if ((uVar5 & 2) == 0) goto LAB_00140da8;
    iVar1 = index->r;
    lVar6 = *(long *)this;
    uVar9 = 0;
  }
  else {
    if (bVar10 == 0) {
LAB_00140da8:
      plVar7 = (long *)QAbstractProxyModel::sourceModel();
      plVar8 = (long *)QAbstractProxyModel::sourceModel();
      local_40 = 0xffffffffffffffff;
      local_38 = 0;
      uStack_30 = 0;
      (**(code **)(*plVar8 + 0x60))(&local_58,plVar8,index->r,index->c);
      uVar5 = (**(code **)(*plVar7 + 0x138))(plVar7,&local_58);
      goto LAB_00140df2;
    }
LAB_00140d93:
    iVar1 = index->c;
    lVar6 = *(long *)this;
    uVar9 = 1;
  }
  uVar5 = (**(code **)(lVar6 + 0x1d0))(this,uVar9,iVar1);
LAB_00140df2:
  return (ItemFlags)(uVar5 | 0x80);
}

Assistant:

Qt::ItemFlags InsertProxyModel::flags(const QModelIndex &index) const
{
    if (!index.isValid())
        return Qt::NoItemFlags;
    if (!sourceModel())
        return Qt::NoItemFlags;
    Q_D(const InsertProxyModel);
    const bool isExtraRow = index.row() == sourceModel()->rowCount() && d->m_insertDirection & InsertRow;
    const bool isExtraCol = index.column() == sourceModel()->columnCount() && d->m_insertDirection & InsertColumn;
    if (isExtraRow && isExtraCol)
        return Qt::NoItemFlags;
    if (isExtraRow)
        return flagForExtra(true, index.column()) | Qt::ItemNeverHasChildren;
    if (isExtraCol)
        return flagForExtra(false, index.row()) | Qt::ItemNeverHasChildren;
    return sourceModel()->flags(sourceModel()->index(index.row(), index.column())) | Qt::ItemNeverHasChildren;
}